

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrDec.c
# Opt level: O3

Dec_Edge_t Rwr_TravCollect_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  Dec_Edge_t DVar2;
  Dec_Node_t *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if ((*(uint *)&pNode->field_0xe >> 0x1e & 1) == 0) {
    if (pNode->TravId == p->nTravIds) {
      DVar1 = (Dec_Edge_t)(*(uint *)&pNode->field_0xe >> 0x10 & 0xff);
    }
    else {
      pNode->TravId = p->nTravIds;
      DVar1 = Rwr_TravCollect_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pGraph);
      DVar1 = (Dec_Edge_t)(*(uint *)&pNode->p0 & 1 ^ (uint)DVar1);
      DVar2 = Rwr_TravCollect_rec(p,(Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),pGraph);
      DVar2 = (Dec_Edge_t)(*(uint *)&pNode->p1 & 1 ^ (uint)DVar2);
      if (*(int *)&pNode->field_0xe < 0) {
        iVar6 = pGraph->nSize;
        pDVar3 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar3 == (Dec_Node_t *)0x0) {
            pDVar3 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar7 = iVar6;
          }
          else {
            pDVar3 = (Dec_Node_t *)realloc(pDVar3,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar7 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar3;
          pGraph->nCap = iVar7 * 2;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar3[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar3[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar3[iVar6].eEdge0 = (Dec_Edge_t)((uint)DVar1 ^ 1);
        pDVar3[iVar6].eEdge1 = DVar2;
        *(uint *)&pDVar3[iVar6].field_0x10 =
             ((uint)DVar2 & 1) << 0x10 | (((uint)DVar1 ^ 1) & 1) << 0xf;
        iVar7 = pGraph->nSize;
        iVar6 = iVar7 * 2;
        pDVar3 = pGraph->pNodes;
        if (iVar7 == pGraph->nCap) {
          if (pDVar3 == (Dec_Node_t *)0x0) {
            pDVar3 = (Dec_Node_t *)malloc((long)iVar6 * 0x18);
            iVar4 = iVar6;
          }
          else {
            pDVar3 = (Dec_Node_t *)realloc(pDVar3,(long)iVar6 * 0x18);
            iVar7 = pGraph->nSize;
            iVar4 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar3;
          pGraph->nCap = iVar4;
        }
        pGraph->nSize = iVar7 + 1;
        pDVar3[iVar7].field_2.pFunc = (void *)0x0;
        (&pDVar3[iVar7].field_2)[1].pFunc = (void *)0x0;
        pDVar3[iVar7].eEdge0 = DVar1;
        pDVar3[iVar7].eEdge1 = (Dec_Edge_t)((uint)DVar2 ^ 1);
        *(uint *)&pDVar3[iVar7].field_0x10 =
             (((uint)DVar2 ^ 1) & 1) << 0x10 | ((uint)DVar1 & 1) << 0xf;
        iVar7 = pGraph->nSize;
        iVar4 = iVar7 * 2;
        pDVar3 = pGraph->pNodes;
        if (iVar7 == pGraph->nCap) {
          if (pDVar3 == (Dec_Node_t *)0x0) {
            pDVar3 = (Dec_Node_t *)malloc((long)iVar4 * 0x18);
            iVar5 = iVar4;
          }
          else {
            pDVar3 = (Dec_Node_t *)realloc(pDVar3,(long)iVar4 * 0x18);
            iVar7 = pGraph->nSize;
            iVar5 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar3;
          pGraph->nCap = iVar5;
        }
        pGraph->nSize = iVar7 + 1;
        pDVar3[iVar7].field_2.pFunc = (void *)0x0;
        (&pDVar3[iVar7].field_2)[1].pFunc = (void *)0x0;
        *(undefined4 *)&pDVar3[iVar7].field_0x10 = 0x4000;
        pDVar3[iVar7].eEdge0 = (Dec_Edge_t)(iVar6 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar3[iVar7].eEdge1 = (Dec_Edge_t)(iVar4 + 0x7ffffffeU & 0x7ffffffe | 1);
        DVar1 = (Dec_Edge_t)((pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
      }
      else {
        iVar6 = pGraph->nSize;
        pDVar3 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar3 == (Dec_Node_t *)0x0) {
            pDVar3 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar7 = iVar6;
          }
          else {
            pDVar3 = (Dec_Node_t *)realloc(pDVar3,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar7 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar3;
          pGraph->nCap = iVar7 * 2;
        }
        pGraph->nSize = iVar6 + 1;
        *(undefined1 (*) [16])&pDVar3[iVar6].field_2 = (undefined1  [16])0x0;
        pDVar3[iVar6].eEdge0 = DVar1;
        pDVar3[iVar6].eEdge1 = DVar2;
        *(uint *)&pDVar3[iVar6].field_0x10 = ((uint)DVar2 & 1) << 0x10 | ((uint)DVar1 & 1) << 0xf;
        DVar1 = (Dec_Edge_t)(pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
      }
      pNode->field_0x10 = DVar1._0_1_;
    }
  }
  else {
    DVar1 = (Dec_Edge_t)(pNode->Id * 2 + 0x7ffffffeU & 0x7ffffffe);
  }
  return DVar1;
}

Assistant:

Dec_Edge_t Rwr_TravCollect_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, Dec_Graph_t * pGraph )
{
    Dec_Edge_t eNode0, eNode1, eNode;
    // elementary variable
    if ( pNode->fUsed )
        return Dec_EdgeCreate( pNode->Id - 1, 0 );
    // previously visited node
    if ( pNode->TravId == p->nTravIds )
        return Dec_IntToEdge( pNode->Volume );
    pNode->TravId = p->nTravIds;
    // solve for children
    eNode0 = Rwr_TravCollect_rec( p, Rwr_Regular(pNode->p0), pGraph );
    if ( Rwr_IsComplement(pNode->p0) )    
        eNode0.fCompl = !eNode0.fCompl;
    eNode1 = Rwr_TravCollect_rec( p, Rwr_Regular(pNode->p1), pGraph );
    if ( Rwr_IsComplement(pNode->p1) )    
        eNode1.fCompl = !eNode1.fCompl;
    // create the decomposition node(s)
    if ( pNode->fExor )
        eNode = Dec_GraphAddNodeXor( pGraph, eNode0, eNode1, 0 );
    else
        eNode = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    // save the result
    pNode->Volume = Dec_EdgeToInt( eNode );
    return eNode;
}